

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O2

bool __thiscall spvtools::val::ValidationState_t::in_block(ValidationState_t *this)

{
  pointer pFVar1;
  BasicBlock *pBVar2;
  
  pFVar1 = (this->module_functions_).
           super__Vector_base<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if ((this->module_functions_).
      super__Vector_base<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>._M_impl.
      super__Vector_impl_data._M_start != pFVar1) {
    pBVar2 = Function::current_block(pFVar1 + -1);
    return pBVar2 != (BasicBlock *)0x0;
  }
  return false;
}

Assistant:

bool ValidationState_t::in_block() const {
  return module_functions_.empty() == false &&
         module_functions_.back().current_block() != nullptr;
}